

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportTryCompileFileGenerator::GenerateMainFile(cmExportTryCompileFileGenerator *this,ostream *os)

{
  pointer ppcVar1;
  cmGeneratorTarget *pcVar2;
  string *psVar3;
  TargetType TVar4;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  cmGeneratorTarget *te;
  ImportPropertyMap properties;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emittedDeps;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  cmGeneratorTarget *local_248;
  allocator<char> local_239;
  string *local_238;
  ostream *local_230;
  string local_228;
  pointer local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_200;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_1d0;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_1a0;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0._M_impl.super__Rb_tree_header._M_header;
  local_1a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d0._M_impl.super__Rb_tree_header._M_header;
  local_1d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_230 = os;
  local_1d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
  while (ppcVar1 = (this->Exports).
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        (this->Exports).
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start != ppcVar1) {
    local_248 = ppcVar1[-1];
    (this->Exports).
    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppcVar1 + -1;
    pVar5 = std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)&local_1a0,&local_248);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&local_1d0,&local_248);
      pcVar2 = local_248;
      TVar4 = cmGeneratorTarget::GetType(local_248);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                (this,local_230,pcVar2,(ulong)TVar4);
      local_200._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_200._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_200._M_impl.super__Rb_tree_header._M_header;
      local_200._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_238 = (this->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_208 = (this->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_200._M_impl.super__Rb_tree_header._M_header._M_right =
           local_200._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if (local_238 == local_208) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_INCLUDE_DIRECTORIES",&local_239);
        FindTargets(&local_50,this,&local_228,local_248,local_238,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_239);
        psVar3 = local_238;
        FindTargets(&local_170,this,&local_228,local_248,local_238,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_COMPILE_DEFINITIONS",&local_239);
        FindTargets(&local_70,this,&local_228,local_248,psVar3,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_COMPILE_OPTIONS",&local_239);
        psVar3 = local_238;
        FindTargets(&local_90,this,&local_228,local_248,local_238,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_AUTOUIC_OPTIONS",&local_239);
        FindTargets(&local_b0,this,&local_228,local_248,psVar3,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_SOURCES",&local_239);
        FindTargets(&local_d0,this,&local_228,local_248,psVar3,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_COMPILE_FEATURES",&local_239);
        FindTargets(&local_f0,this,&local_228,local_248,psVar3,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_LINK_OPTIONS",&local_239);
        FindTargets(&local_110,this,&local_228,local_248,psVar3,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_LINK_DIRECTORIES",&local_239);
        FindTargets(&local_130,this,&local_228,local_248,psVar3,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"INTERFACE_LINK_DEPENDS",&local_239);
        FindTargets(&local_150,this,&local_228,local_248,psVar3,
                    (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_228);
        local_238 = psVar3 + 1;
      }
      PopulateProperties(this,local_248,(ImportPropertyMap *)&local_200,
                         (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                          *)&local_1d0);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                (this,local_248,local_230,&local_200);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_200);
    }
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_1d0);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_1a0);
  return true;
}

Assistant:

bool cmExportTryCompileFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::set<cmGeneratorTarget const*> emitted;
  std::set<cmGeneratorTarget const*> emittedDeps;
  while (!this->Exports.empty()) {
    cmGeneratorTarget const* te = this->Exports.back();
    this->Exports.pop_back();
    if (emitted.insert(te).second) {
      emittedDeps.insert(te);
      this->GenerateImportTargetCode(os, te, te->GetType());

      ImportPropertyMap properties;

      for (std::string const& lang : this->Languages) {
#define FIND_TARGETS(PROPERTY)                                                \
  this->FindTargets("INTERFACE_" #PROPERTY, te, lang, emittedDeps);

        CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(FIND_TARGETS)

#undef FIND_TARGETS
      }

      this->PopulateProperties(te, properties, emittedDeps);

      this->GenerateInterfaceProperties(te, os, properties);
    }
  }
  return true;
}